

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor.h
# Opt level: O0

int __thiscall despot::Floor::GetIndex(Floor *this,int x,int y)

{
  int local_24;
  int y_local;
  int x_local;
  Floor *this_local;
  
  if ((((x < 0) || (this->num_cols_ <= x)) || (y < 0)) || (this->num_rows_ <= y)) {
    local_24 = (int)INVALID;
  }
  else {
    local_24 = this->floor_[y][x];
  }
  return local_24;
}

Assistant:

inline int GetIndex(int x, int y) const {
		return
			(x >= 0 && x < num_cols_ && y >= 0 && y < num_rows_) ?
				floor_[y][x] : INVALID;
	}